

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  bool bVar2;
  undefined1 uVar3;
  float *pfVar4;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *bboxes;
  size_type sVar5;
  int *piVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar10;
  float *outptr_1;
  int i_4;
  Mat *roi_score_blob;
  float *outptr;
  int i_3;
  Mat *roi_blob;
  int picked_count;
  vector<int,_std::allocator<int>_> picked;
  Rect r;
  float pb_h_1;
  float pb_w_1;
  float *pb_2;
  int i_2;
  float *scoreptr;
  Mat pbs_2;
  int q_2;
  float min_boxsize;
  float im_scale;
  vector<float,_std::allocator<float>_> scores;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  float *pb_1;
  int i_1;
  Mat pbs_1;
  int q_1;
  float im_h;
  float im_w;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float cy;
  float cx;
  float dh;
  float dw;
  float dy;
  float dx;
  float *pb;
  int j;
  float anchor_x;
  int i;
  float anchor_h;
  float anchor_w;
  float anchor_y;
  float *anchor;
  Mat pbs;
  float *bbox_hptr;
  float *bbox_wptr;
  float *bbox_yptr;
  float *bbox_xptr;
  int q;
  Mat proposals;
  int num_anchors;
  int h;
  int w;
  Mat *im_info_blob;
  Mat *bbox_blob;
  Mat *score_blob;
  Mat *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffad0;
  int in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  int iVar11;
  Mat *in_stack_fffffffffffffae0;
  Mat *this_00;
  float *in_stack_fffffffffffffb50;
  float fVar12;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb58;
  Mat local_438;
  Mat *local_400;
  int local_3f4;
  reference local_3f0;
  Mat local_3e8;
  vector<float,_std::allocator<float>_> *local_3b0;
  int local_3a8;
  undefined4 local_3a4;
  reference local_3a0;
  int local_398;
  int local_394;
  vector<int,_std::allocator<int>_> local_390;
  float local_378;
  float local_374;
  float local_370;
  float local_36c;
  float local_368;
  float local_364;
  float *local_360;
  int local_354;
  Mat local_350;
  float *local_318;
  Mat local_310;
  int local_2d4;
  float local_2d0;
  float local_2cc;
  vector<float,_std::allocator<float>_> local_2c8;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_2b0;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  vector<int,_std::allocator<int>_> *local_278;
  int local_26c;
  Mat local_268;
  int local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  float *local_1f8;
  int local_1f0;
  float local_1ec;
  int local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float *local_1d8;
  Mat local_1d0;
  Mat local_198;
  float *local_160;
  Mat local_158;
  float *local_120;
  Mat local_118;
  float *local_e0;
  Mat local_d8;
  float *local_a0;
  int local_98;
  Mat local_88;
  int local_4c;
  int local_48;
  int local_44;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  local_44 = local_30->w;
  local_48 = local_30->h;
  local_4c = *(int *)(in_RDI + 0x130);
  Mat::Mat(&local_88);
  Mat::create(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad8,
              (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),
              CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
              (Allocator *)in_stack_fffffffffffffac0);
  for (local_98 = 0; local_98 < local_4c; local_98 = local_98 + 1) {
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_d8);
    Mat::~Mat((Mat *)0x1231fb);
    local_a0 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_118);
    Mat::~Mat((Mat *)0x123256);
    local_e0 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_158);
    Mat::~Mat((Mat *)0x1232b1);
    local_120 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_198);
    Mat::~Mat((Mat *)0x12330c);
    local_160 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    local_1d8 = Mat::row((Mat *)(in_RDI + 0x108),local_98);
    local_1dc = local_1d8[1];
    local_1e0 = local_1d8[2] - *local_1d8;
    local_1e4 = local_1d8[3] - local_1d8[1];
    for (local_1e8 = 0; local_1e8 < local_48; local_1e8 = local_1e8 + 1) {
      local_1ec = *local_1d8;
      for (local_1f0 = 0; local_1f0 < local_44; local_1f0 = local_1f0 + 1) {
        local_1f8 = Mat::row(&local_1d0,local_1e8 * local_44 + local_1f0);
        fVar1 = local_1e0;
        local_1fc = local_a0[local_1f0];
        local_200 = local_e0[local_1f0];
        local_204 = local_120[local_1f0];
        local_208 = local_160[local_1f0];
        local_20c = local_1ec + local_1e0 * 0.5;
        local_210 = local_1dc + local_1e4 * 0.5;
        local_214 = local_20c + local_1e0 * local_1fc;
        local_218 = local_210 + local_1e4 * local_200;
        dVar10 = std::exp((double)(ulong)(uint)local_204);
        fVar12 = local_1e4;
        local_21c = fVar1 * SUB84(dVar10,0);
        dVar10 = std::exp((double)(ulong)(uint)local_208);
        local_220 = fVar12 * SUB84(dVar10,0);
        *local_1f8 = local_214 - local_21c * 0.5;
        local_1f8[1] = local_218 - local_220 * 0.5;
        local_1f8[2] = local_214 + local_21c * 0.5;
        local_1f8[3] = local_218 + local_220 * 0.5;
        local_1ec = (float)*(int *)(in_RDI + 0x80) + local_1ec;
      }
      local_a0 = local_a0 + local_44;
      local_e0 = local_e0 + local_44;
      local_120 = local_120 + local_44;
      local_160 = local_160 + local_44;
      local_1dc = (float)*(int *)(in_RDI + 0x80) + local_1dc;
    }
    Mat::~Mat((Mat *)0x123893);
  }
  pfVar4 = Mat::operator[](local_40,1);
  local_224 = *pfVar4;
  bboxes = (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)Mat::operator[](local_40,0);
  local_228 = *(float *)&(bboxes->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>).
                         _M_impl.super__Vector_impl_data._M_start;
  for (local_22c = 0; local_22c < local_4c; local_22c = local_22c + 1) {
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    for (local_26c = 0; local_26c < local_44 * local_48; local_26c = local_26c + 1) {
      in_stack_fffffffffffffb58 =
           (vector<int,_std::allocator<int>_> *)Mat::row(&local_268,local_26c);
      local_27c = local_224 + -1.0;
      local_278 = in_stack_fffffffffffffb58;
      in_stack_fffffffffffffb50 = std::min<float>((float *)in_stack_fffffffffffffb58,&local_27c);
      local_280 = 0.0;
      pfVar4 = std::max<float>(in_stack_fffffffffffffb50,&local_280);
      *(float *)&(local_278->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start = *pfVar4;
      local_284 = local_228 + -1.0;
      pfVar4 = std::min<float>((float *)((long)&(local_278->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start + 4),
                               &local_284);
      local_288 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_288);
      *(float *)((long)&(local_278->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + 4) = *pfVar4;
      local_28c = local_224 + -1.0;
      pfVar4 = std::min<float>((float *)&(local_278->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish,&local_28c);
      local_290 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_290);
      *(float *)&(local_278->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish = *pfVar4;
      local_294 = local_228 + -1.0;
      pfVar4 = std::min<float>((float *)((long)&(local_278->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_finish + 4),
                               &local_294);
      local_298 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_298);
      *(float *)((long)&(local_278->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish + 4) = *pfVar4;
    }
    Mat::~Mat((Mat *)0x123bd8);
  }
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)0x123bfb);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x123c08);
  pfVar4 = Mat::operator[](local_40,2);
  local_2cc = *pfVar4;
  local_2d0 = (float)*(int *)(in_RDI + 0x94) * local_2cc;
  for (local_2d4 = 0; fVar12 = (float)((ulong)in_stack_fffffffffffffb50 >> 0x20),
      local_2d4 < local_4c; local_2d4 = local_2d4 + 1) {
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_350);
    Mat::~Mat((Mat *)0x123cda);
    local_318 = pfVar4;
    for (local_354 = 0; local_354 < local_44 * local_48; local_354 = local_354 + 1) {
      local_360 = Mat::row(&local_310,local_354);
      local_364 = (local_360[2] - *local_360) + 1.0;
      local_368 = (local_360[3] - local_360[1]) + 1.0;
      if ((local_2d0 <= local_364) && (local_2d0 <= local_368)) {
        local_378 = *local_360;
        local_374 = local_360[1];
        local_370 = local_360[2];
        local_36c = local_360[3];
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffad0,
                   (value_type *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_fffffffffffffad0,
                   (value_type_conflict2 *)
                   CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
      }
    }
    Mat::~Mat((Mat *)0x123ecd);
  }
  qsort_descent_inplace<ncnn::Rect>
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffad0,
             (vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
  if ((0 < *(int *)(in_RDI + 0x88)) &&
     (iVar11 = *(int *)(in_RDI + 0x88),
     sVar5 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::size(&local_2b0),
     iVar11 < (int)sVar5)) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize
              ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffae0,
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffae0,
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x123f97);
  nms_sorted_bboxes(bboxes,in_stack_fffffffffffffb58,fVar12);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_390);
  local_398 = (int)sVar5;
  piVar6 = std::min<int>(&local_398,(int *)(in_RDI + 0x8c));
  local_394 = *piVar6;
  this_00 = (Mat *)0x0;
  local_3a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  Mat::create(this_00,in_stack_fffffffffffffadc,in_stack_fffffffffffffad8,
              (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),
              CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
              (Allocator *)in_stack_fffffffffffffac0);
  bVar2 = Mat::empty(in_stack_fffffffffffffac0);
  iVar11 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffadc);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    for (local_3a8 = 0; local_3a8 < local_394; local_3a8 = local_3a8 + 1) {
      Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                   (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
      in_stack_fffffffffffffad0 =
           (vector<float,_std::allocator<float>_> *)Mat::operator_cast_to_float_(&local_3e8);
      Mat::~Mat((Mat *)0x1240f8);
      local_3b0 = in_stack_fffffffffffffad0;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_390,(long)local_3a8);
      pvVar8 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2b0,(long)*pvVar7);
      *(float *)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                  &local_3b0->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                 super__Vector_impl_data._M_start = pvVar8->x1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_390,(long)local_3a8);
      pvVar8 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2b0,(long)*pvVar7);
      *(float *)((long)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                         &local_3b0->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                        super__Vector_impl_data._M_start + 4) = pvVar8->y1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_390,(long)local_3a8);
      pvVar8 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2b0,(long)*pvVar7);
      *(float *)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                  &local_3b0->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                 super__Vector_impl_data._M_finish = pvVar8->x2;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_390,(long)local_3a8);
      pvVar8 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2b0,(long)*pvVar7);
      *(float *)((long)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                         &local_3b0->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                        super__Vector_impl_data._M_finish + 4) = pvVar8->y2;
    }
    sVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
    if (1 < sVar5) {
      local_3f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,1);
      Mat::create(this_00,iVar11,in_stack_fffffffffffffad8,
                  (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                  CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                  (Allocator *)in_stack_fffffffffffffac0);
      uVar3 = Mat::empty(in_stack_fffffffffffffac0);
      if ((bool)uVar3) {
        local_4 = -100;
        goto LAB_0012439d;
      }
      for (local_3f4 = 0; local_3f4 < local_394; local_3f4 = local_3f4 + 1) {
        Mat::channel((Mat *)CONCAT17(uVar3,in_stack_fffffffffffffac8),
                     (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
        in_stack_fffffffffffffac0 = (Mat *)Mat::operator_cast_to_float_(&local_438);
        Mat::~Mat((Mat *)0x12430a);
        local_400 = in_stack_fffffffffffffac0;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_390,(long)local_3f4);
        pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_2c8,(long)*pvVar7);
        *(value_type *)&local_400->data = *pvVar9;
      }
    }
    local_4 = 0;
  }
LAB_0012439d:
  local_3a4 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffad0);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffad0);
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffad0);
  Mat::~Mat((Mat *)0x1243d1);
  return local_4;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}